

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

int __thiscall
array<CSkins::CSkinPart,_allocator_default<CSkins::CSkinPart>_>::insert
          (array<CSkins::CSkinPart,_allocator_default<CSkins::CSkinPart>_> *this,CSkinPart *item,
          range r)

{
  int iVar1;
  long lVar2;
  long lVar3;
  CSkinPart *pCVar4;
  char *pcVar5;
  int iVar6;
  long lVar7;
  int new_len;
  byte bVar8;
  
  bVar8 = 0;
  if (r.begin < r.end) {
    dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/base/tl/range.h"
                   ,0x96,1,"empty");
    iVar6 = (int)((long)r.begin - (long)this->list >> 2) * -0x42108421;
    incsize(this);
    iVar1 = this->num_elements;
    lVar7 = (long)iVar1;
    new_len = iVar1 + 1;
    if (this->list_size <= iVar1) {
      alloc(this,new_len);
    }
    this->num_elements = new_len;
    if (iVar6 < iVar1) {
      lVar3 = lVar7 * 0x7c;
      do {
        pCVar4 = this->list + (long)new_len + -2;
        pcVar5 = this->list->m_aName + lVar3 + -4;
        for (lVar2 = 0x1f; lVar2 != 0; lVar2 = lVar2 + -1) {
          *(int *)pcVar5 = pCVar4->m_Flags;
          pCVar4 = (CSkinPart *)((long)pCVar4 + ((ulong)bVar8 * -2 + 1) * 4);
          pcVar5 = pcVar5 + ((ulong)bVar8 * -2 + 1) * 4;
        }
        lVar7 = lVar7 + -1;
        new_len = new_len + -1;
        lVar3 = lVar3 + -0x7c;
      } while (iVar6 < lVar7);
    }
    pCVar4 = this->list + iVar6;
    for (lVar7 = 0x1f; lVar7 != 0; lVar7 = lVar7 + -1) {
      pCVar4->m_Flags = item->m_Flags;
      item = (CSkinPart *)((long)item + (ulong)bVar8 * -8 + 4);
      pCVar4 = (CSkinPart *)((long)pCVar4 + ((ulong)bVar8 * -2 + 1) * 4);
    }
    return this->num_elements + -1;
  }
  iVar1 = add(this,item);
  return iVar1;
}

Assistant:

int insert(const T& item, range r)
	{
		if(r.empty())
			return add(item);

		int index = (int)(&r.front()-list);
		incsize();
		set_size(size()+1);

		for(int i = num_elements-1; i > index; i--)
			list[i] = list[i-1];

		list[index] = item;

		return num_elements-1;
	}